

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::BiOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,BiOpExpr *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Lexer *pLVar4;
  Expr *pEVar5;
  BiOpExpr *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  BiOpExpr *local_98;
  BiOpExpr *biopexpr;
  Expr *expr;
  string args;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  BiOpExpr *local_18;
  BiOpExpr *this_local;
  string *result;
  
  local_18 = this;
  this_local = (BiOpExpr *)__return_storage_ptr__;
  TVar2 = getOperatorType(this);
  if ((ushort)(TVar2 - TOK_OP_BRACKET_OPEN) < 3) {
    local_19 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    TVar2 = getOperatorType(this);
    if (TVar2 == TOK_OP_BRACKET_OPEN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
    }
    else if (TVar2 == TOK_OP_ARR_BRACKET_OPEN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
    }
    else if (TVar2 == TOK_OP_TEMPL_BRACKET_OPEN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unexpected branch reached",&local_41);
      fatal("expr.cpp",0x330,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    pEVar5 = getLeft(this);
    (*pEVar5->_vptr_Expr[2])();
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(args.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(args.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
    std::__cxx11::string::string((string *)&expr);
    biopexpr = (BiOpExpr *)getRight(this);
    while (bVar1 = isBiOpExpr(&biopexpr->super_Expr,TOK_OP_COMMA), bVar1) {
      if (biopexpr == (BiOpExpr *)0x0) {
        local_348 = (BiOpExpr *)0x0;
      }
      else {
        local_348 = (BiOpExpr *)__dynamic_cast(biopexpr,&Expr::typeinfo,&typeinfo,0);
      }
      local_98 = local_348;
      pEVar5 = getRight(local_348);
      (*pEVar5->_vptr_Expr[2])();
      std::operator+(&local_d8,' ',&local_f8);
      std::operator+(&local_b8,&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr);
      std::__cxx11::string::operator=((string *)&expr,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      biopexpr = (BiOpExpr *)getLeft(local_98);
    }
    (*(biopexpr->super_Expr)._vptr_Expr[2])();
    std::operator+(&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&expr);
    TVar2 = getOperatorType(this);
    if (TVar2 == TOK_OP_BRACKET_OPEN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
    }
    else if (TVar2 == TOK_OP_ARR_BRACKET_OPEN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
    }
    else if (TVar2 == TOK_OP_TEMPL_BRACKET_OPEN) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"Unexpected branch reached",&local_159);
      fatal("expr.cpp",0x34a,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    local_19 = 1;
    std::__cxx11::string::~string((string *)&expr);
    if ((local_19 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  else if (TVar2 == TOK_OP_NONE) {
    pEVar5 = getLeft(this);
    (*pEVar5->_vptr_Expr[2])();
    std::operator+(&local_1c0,"( ",&local_1e0);
    std::operator+(&local_1a0,&local_1c0,' ');
    pEVar5 = getRight(this);
    (*pEVar5->_vptr_Expr[2])();
    std::operator+(&local_180,&local_1a0,&local_200);
    std::operator+(__return_storage_ptr__,&local_180,')');
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    pTVar3 = getOperatorToken(this);
    pLVar4 = Expr::getLexer(&this->super_Expr);
    (*pTVar3->_vptr_Token[2])(&local_2c0,pTVar3,pLVar4);
    std::operator+(&local_2a0,'(',&local_2c0);
    std::operator+(&local_280,&local_2a0,' ');
    pEVar5 = getLeft(this);
    (*pEVar5->_vptr_Expr[2])();
    std::operator+(&local_260,&local_280,&local_2e0);
    std::operator+(&local_240,&local_260,' ');
    pEVar5 = getRight(this);
    (*pEVar5->_vptr_Expr[2])();
    std::operator+(&local_220,&local_240,&local_300);
    std::operator+(__return_storage_ptr__,&local_220,')');
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BiOpExpr::toString() const noexcept {
  switch (getOperatorType()) {
  case TokenType::TOK_OP_BRACKET_OPEN:
  case TokenType::TOK_OP_ARR_BRACKET_OPEN:
  case TokenType::TOK_OP_TEMPL_BRACKET_OPEN: {
    std::string result;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += '(';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += '[';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '{';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }
    result += getLeft().toString();
    result += ' ';
    std::string args;
    const Expr * expr = &getRight();
    while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
      const BiOpExpr * biopexpr = dynamic_cast<const BiOpExpr*>(expr);
      args = ' ' + biopexpr->getRight().toString() + args;
      expr = &biopexpr->getLeft();
    }

    args = expr->toString() + args;
    result += args;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += ')';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += ']';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '}';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }

    return result;
  }
  case TokenType::TOK_OP_NONE:
    return "( " + getLeft().toString() + ' ' + getRight().toString() + ')';
  default:
    return '(' + getOperatorToken().toString(getLexer()) + ' ' +
      getLeft().toString() + ' ' + getRight().toString() + ')';
  }
}